

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

size_t __thiscall c4::yml::Tree::resolve_tag(Tree *this,substr output,csubstr tag,size_t node_id)

{
  char cVar1;
  char *pcVar2;
  ulong uVar3;
  size_t sVar4;
  code *pcVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  Location LVar11;
  Location LVar12;
  Location LVar13;
  Location LVar14;
  Location LVar15;
  Location LVar16;
  ulong uVar17;
  bool bVar18;
  size_t sVar19;
  undefined1 *puVar20;
  undefined1 *puVar21;
  undefined1 *puVar22;
  long lVar23;
  long lVar24;
  byte bVar25;
  ulong uVar26;
  ulong uVar27;
  TagDirective *pTVar28;
  long lVar29;
  char cVar30;
  undefined1 *puVar31;
  ro_substr chars;
  ro_substr chars_00;
  csubstr rest;
  char msg [41];
  basic_substring<const_char> local_288;
  basic_substring<const_char> local_278;
  undefined1 uStack_268;
  undefined2 uStack_267;
  undefined1 uStack_265;
  undefined2 uStack_264;
  undefined2 uStack_262;
  undefined1 uStack_260;
  undefined2 uStack_25f;
  undefined1 uStack_25d;
  undefined4 uStack_25c;
  undefined1 uStack_258;
  char acStack_257 [23];
  undefined1 *local_240;
  TagDirective *local_238;
  char *local_230;
  undefined1 *local_228;
  ulong local_220;
  long local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  ulong local_1f8;
  TagDirective *local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  char *pcStack_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  char *pcStack_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  char *pcStack_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  char *pcStack_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  char *pcStack_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  char *pcStack_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  char *pcStack_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  char *pcStack_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  uVar27 = tag.len;
  local_210 = tag.str;
  local_200 = (undefined1 *)output.len;
  local_230 = output.str;
  local_208 = local_230 + 1;
  local_1f0 = this->m_tag_directives;
  lVar29 = 3;
  do {
    pcVar2 = local_1f0[lVar29].handle.str;
    uVar3 = local_1f0[lVar29].handle.len;
    bVar18 = false;
    if (pcVar2 != (char *)0x0 && uVar3 != 0) {
      bVar18 = false;
      if ((uVar3 <= uVar27) && (*local_210 == *pcVar2)) {
        pTVar28 = local_1f0 + lVar29;
        uVar17 = 1;
        do {
          uVar26 = uVar17;
          if (uVar3 == uVar26) break;
          uVar17 = uVar26 + 1;
        } while (local_210[uVar26] == pcVar2[uVar26]);
        if ((uVar3 <= uVar26) && (bVar18 = false, pTVar28->next_node_id <= node_id)) {
          if (uVar27 < uVar3) {
            uStack_258 = 100;
            builtin_strncpy(acStack_257,"le.len)",8);
            uStack_268 = 0x61;
            uStack_267 = 0x2e67;
            uStack_265 = 0x6c;
            uStack_264 = 0x6e65;
            uStack_262 = 0x3e20;
            uStack_260 = 0x3d;
            uStack_25f = 0x7420;
            uStack_25d = 100;
            uStack_25c = 0x6e61682e;
            local_278.str = (char *)0x6166206b63656863;
            local_278.len._0_1_ = 0x69;
            local_278.len._1_2_ = 0x656c;
            local_278.len._3_1_ = 100;
            local_278.len._4_2_ = 0x203a;
            local_278.len._6_2_ = 0x7428;
            if (((s_error_flags & 1) != 0) && (bVar18 = is_debugger_attached(), bVar18)) {
              pcVar5 = (code *)swi(3);
              sVar19 = (*pcVar5)();
              return sVar19;
            }
            local_58 = 0;
            uStack_50 = 0x682c;
            local_48 = 0;
            pcStack_40 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_38 = 0x65;
            LVar6.super_LineCol.col = 0;
            LVar6.super_LineCol.offset = SUB168(ZEXT816(0x682c) << 0x40,0);
            LVar6.super_LineCol.line = SUB168(ZEXT816(0x682c) << 0x40,8);
            LVar6.name.str =
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            LVar6.name.len = 0x65;
            (*(this->m_callbacks).m_error)
                      ((char *)&local_278,0x29,LVar6,(this->m_callbacks).m_user_data);
          }
          uVar3 = (pTVar28->handle).len;
          local_220 = node_id;
          if (uVar27 < uVar3) {
            if (((s_error_flags & 1) != 0) && (bVar18 = is_debugger_attached(), bVar18)) {
              pcVar5 = (code *)swi(3);
              sVar19 = (*pcVar5)();
              return sVar19;
            }
            handle_error(0x1fc017,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1533,"first >= 0 && first <= len");
          }
          basic_substring<const_char>::basic_substring(&local_278,local_210 + uVar3,uVar27 - uVar3);
          local_288.len =
               CONCAT26(local_278.len._6_2_,
                        CONCAT24(local_278.len._4_2_,
                                 CONCAT13(local_278.len._3_1_,
                                          CONCAT21(local_278.len._1_2_,(undefined1)local_278.len))))
          ;
          local_288.str = local_278.str;
          local_240 = (undefined1 *)(local_288.len + (pTVar28->prefix).len + 2);
          sVar19 = basic_substring<const_char>::first_of(&local_288,'%',0);
          node_id = local_220;
          if (sVar19 == 0xffffffffffffffff) {
LAB_001c7982:
            pcVar2 = local_208;
            if (local_240 <= local_200) {
              *local_230 = '<';
              memcpy(local_208,(pTVar28->prefix).str,(pTVar28->prefix).len);
              sVar19 = local_288.len;
              memcpy(pcVar2 + (pTVar28->prefix).len,local_288.str,local_288.len);
              *(undefined1 *)(sVar19 + (long)(pcVar2 + (pTVar28->prefix).len)) = 0x3e;
            }
          }
          else {
            lVar24 = 0;
            local_238 = pTVar28;
            do {
              sVar19 = basic_substring<const_char>::first_of(&local_288,'%',sVar19 + 1);
              pTVar28 = local_238;
              lVar24 = lVar24 + -1;
            } while (sVar19 != 0xffffffffffffffff);
            if (lVar24 == 0) goto LAB_001c7982;
            sVar19 = basic_substring<const_char>::first_of(&local_288,'%',0);
            if (sVar19 == 0xffffffffffffffff) {
              uStack_268 = 0x6f;
              uStack_267 = 0x2073;
              uStack_265 = 0x21;
              uStack_264 = 0x203d;
              uStack_262 = 0x706e;
              uStack_260 = 0x6f;
              uStack_25f = 0x2973;
              uStack_25d = 0;
              local_278.str = (char *)0x6166206b63656863;
              local_278.len._0_1_ = 0x69;
              local_278.len._1_2_ = 0x656c;
              local_278.len._3_1_ = 100;
              local_278.len._4_2_ = 0x203a;
              local_278.len._6_2_ = 0x7028;
              if (((s_error_flags & 1) != 0) && (bVar18 = is_debugger_attached(), bVar18)) {
                pcVar5 = (code *)swi(3);
                sVar19 = (*pcVar5)();
                return sVar19;
              }
              local_80 = 0;
              uStack_78 = 0x683e;
              local_70 = 0;
              pcStack_68 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_60 = 0x65;
              LVar7.super_LineCol.col = 0;
              LVar7.super_LineCol.offset = SUB168(ZEXT816(0x683e) << 0x40,0);
              LVar7.super_LineCol.line = SUB168(ZEXT816(0x683e) << 0x40,8);
              LVar7.name.str =
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              LVar7.name.len = 0x65;
              (*(this->m_callbacks).m_error)
                        ((char *)&local_278,0x1c,LVar7,(this->m_callbacks).m_user_data);
            }
            do {
              local_1f8 = uVar27;
              puVar21 = (undefined1 *)(sVar19 + 1);
              chars.len = 0x16;
              chars.str = "0123456789abcdefABCDEF";
              puVar20 = (undefined1 *)
                        basic_substring<const_char>::first_not_of(&local_288,chars,(size_t)puVar21);
              if (puVar20 == (undefined1 *)0xffffffffffffffff) {
                puVar20 = (undefined1 *)local_288.len;
              }
              if (puVar20 <= puVar21) {
                uStack_268 = 0x73;
                uStack_267 = 0x312b;
                uStack_265 = 0x20;
                uStack_264 = 0x203c;
                uStack_262 = 0x656e;
                uStack_260 = 0x78;
                uStack_25f = 0x74;
                local_278.str = (char *)0x6166206b63656863;
                local_278.len._0_1_ = 0x69;
                local_278.len._1_2_ = 0x656c;
                local_278.len._3_1_ = 100;
                local_278.len._4_2_ = 0x203a;
                local_278.len._6_2_ = 0x6f70;
                if (((s_error_flags & 1) != 0) && (bVar18 = is_debugger_attached(), bVar18)) {
                  pcVar5 = (code *)swi(3);
                  sVar19 = (*pcVar5)();
                  return sVar19;
                }
                local_a8 = 0;
                uStack_a0 = 0x6843;
                local_98 = 0;
                pcStack_90 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_88 = 0x65;
                LVar8.super_LineCol.col = 0;
                LVar8.super_LineCol.offset = SUB168(ZEXT816(0x6843) << 0x40,0);
                LVar8.super_LineCol.line = SUB168(ZEXT816(0x6843) << 0x40,8);
                LVar8.name.str =
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                LVar8.name.len = 0x65;
                (*(this->m_callbacks).m_error)
                          ((char *)&local_278,0x1b,LVar8,(this->m_callbacks).m_user_data);
              }
              if (puVar20 < (undefined1 *)(sVar19 + 3)) {
                uStack_268 = 0x73;
                uStack_267 = 0x312b;
                uStack_265 = 0x20;
                uStack_264 = 0x202b;
                uStack_262 = 0x2032;
                uStack_260 = 0x3c;
                uStack_25f = 0x203d;
                uStack_25d = 0x6e;
                uStack_25c = 0x747865;
                local_278.str = (char *)0x6166206b63656863;
                local_278.len._0_1_ = 0x69;
                local_278.len._1_2_ = 0x656c;
                local_278.len._3_1_ = 100;
                local_278.len._4_2_ = 0x203a;
                local_278.len._6_2_ = 0x6f70;
                if (((s_error_flags & 1) != 0) && (bVar18 = is_debugger_attached(), bVar18)) {
                  pcVar5 = (code *)swi(3);
                  sVar19 = (*pcVar5)();
                  return sVar19;
                }
                local_d0 = 0;
                uStack_c8 = 0x6844;
                local_c0 = 0;
                pcStack_b8 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_b0 = 0x65;
                LVar9.super_LineCol.col = 0;
                LVar9.super_LineCol.offset = SUB168(ZEXT816(0x6844) << 0x40,0);
                LVar9.super_LineCol.line = SUB168(ZEXT816(0x6844) << 0x40,8);
                LVar9.name.str =
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                LVar9.name.len = 0x65;
                (*(this->m_callbacks).m_error)
                          ((char *)&local_278,0x20,LVar9,(this->m_callbacks).m_user_data);
              }
              local_240 = local_240 + ((long)puVar21 - (long)puVar20);
              sVar19 = basic_substring<const_char>::first_of(&local_288,'%',(size_t)puVar21);
              uVar27 = local_1f8;
            } while (sVar19 != 0xffffffffffffffff);
            node_id = local_220;
            if (local_240 <= local_200) {
              *local_230 = '<';
              sVar4 = (pTVar28->prefix).len;
              memcpy(local_208,(pTVar28->prefix).str,sVar4);
              puVar21 = (undefined1 *)basic_substring<const_char>::first_of(&local_288,'%',0);
              if (puVar21 == (undefined1 *)0xffffffffffffffff) {
                uStack_268 = 0x6f;
                uStack_267 = 0x2073;
                uStack_265 = 0x21;
                uStack_264 = 0x203d;
                uStack_262 = 0x706e;
                uStack_260 = 0x6f;
                uStack_25f = 0x2973;
                uStack_25d = 0;
                local_278.str = (char *)0x6166206b63656863;
                local_278.len._0_1_ = 0x69;
                local_278.len._1_2_ = 0x656c;
                local_278.len._3_1_ = 100;
                local_278.len._4_2_ = 0x203a;
                local_278.len._6_2_ = 0x7028;
                if (((s_error_flags & 1) != 0) && (bVar18 = is_debugger_attached(), bVar18)) {
                  pcVar5 = (code *)swi(3);
                  sVar19 = (*pcVar5)();
                  return sVar19;
                }
                local_f8 = 0;
                uStack_f0 = 0x6851;
                local_e8 = 0;
                pcStack_e0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_d8 = 0x65;
                LVar10.super_LineCol.col = 0;
                LVar10.super_LineCol.offset = SUB168(ZEXT816(0x6851) << 0x40,0);
                LVar10.super_LineCol.line = SUB168(ZEXT816(0x6851) << 0x40,8);
                LVar10.name.str =
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                LVar10.name.len = 0x65;
                (*(this->m_callbacks).m_error)
                          ((char *)&local_278,0x1c,LVar10,(this->m_callbacks).m_user_data);
              }
              local_218 = sVar4 + 1;
              puVar20 = (undefined1 *)0x0;
              do {
                pTVar28 = (TagDirective *)(puVar21 + 1);
                chars_00.len = 0x16;
                chars_00.str = "0123456789abcdefABCDEF";
                puVar22 = (undefined1 *)
                          basic_substring<const_char>::first_not_of
                                    (&local_288,chars_00,(size_t)pTVar28);
                if (puVar22 == (undefined1 *)0xffffffffffffffff) {
                  puVar22 = (undefined1 *)local_288.len;
                }
                if (puVar22 <= pTVar28) {
                  uStack_268 = 0x73;
                  uStack_267 = 0x312b;
                  uStack_265 = 0x20;
                  uStack_264 = 0x203c;
                  uStack_262 = 0x656e;
                  uStack_260 = 0x78;
                  uStack_25f = 0x74;
                  local_278.str = (char *)0x6166206b63656863;
                  local_278.len._0_1_ = 0x69;
                  local_278.len._1_2_ = 0x656c;
                  local_278.len._3_1_ = 100;
                  local_278.len._4_2_ = 0x203a;
                  local_278.len._6_2_ = 0x6f70;
                  if (((s_error_flags & 1) != 0) && (bVar18 = is_debugger_attached(), bVar18)) {
                    pcVar5 = (code *)swi(3);
                    sVar19 = (*pcVar5)();
                    return sVar19;
                  }
                  local_120 = 0;
                  uStack_118 = 0x6856;
                  local_110 = 0;
                  pcStack_108 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                  ;
                  local_100 = 0x65;
                  LVar11.super_LineCol.col = 0;
                  LVar11.super_LineCol.offset = SUB168(ZEXT816(0x6856) << 0x40,0);
                  LVar11.super_LineCol.line = SUB168(ZEXT816(0x6856) << 0x40,8);
                  LVar11.name.str =
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                  ;
                  LVar11.name.len = 0x65;
                  (*(this->m_callbacks).m_error)
                            ((char *)&local_278,0x1b,LVar11,(this->m_callbacks).m_user_data);
                }
                if (puVar22 < puVar21 + 3) {
                  uStack_268 = 0x73;
                  uStack_267 = 0x312b;
                  uStack_265 = 0x20;
                  uStack_264 = 0x202b;
                  uStack_262 = 0x2032;
                  uStack_260 = 0x3c;
                  uStack_25f = 0x203d;
                  uStack_25d = 0x6e;
                  uStack_25c = 0x747865;
                  local_278.str = (char *)0x6166206b63656863;
                  local_278.len._0_1_ = 0x69;
                  local_278.len._1_2_ = 0x656c;
                  local_278.len._3_1_ = 100;
                  local_278.len._4_2_ = 0x203a;
                  local_278.len._6_2_ = 0x6f70;
                  if (((s_error_flags & 1) != 0) && (bVar18 = is_debugger_attached(), bVar18)) {
                    pcVar5 = (code *)swi(3);
                    sVar19 = (*pcVar5)();
                    return sVar19;
                  }
                  local_148 = 0;
                  uStack_140 = 0x6857;
                  local_138 = 0;
                  pcStack_130 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                  ;
                  local_128 = 0x65;
                  LVar12.super_LineCol.col = 0;
                  LVar12.super_LineCol.offset = SUB168(ZEXT816(0x6857) << 0x40,0);
                  LVar12.super_LineCol.line = SUB168(ZEXT816(0x6857) << 0x40,8);
                  LVar12.name.str =
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                  ;
                  LVar12.name.len = 0x65;
                  (*(this->m_callbacks).m_error)
                            ((char *)&local_278,0x20,LVar12,(this->m_callbacks).m_user_data);
                }
                local_238 = pTVar28;
                if (local_288.len < pTVar28) {
                  if (((s_error_flags & 1) != 0) && (bVar18 = is_debugger_attached(), bVar18)) {
                    pcVar5 = (code *)swi(3);
                    sVar19 = (*pcVar5)();
                    return sVar19;
                  }
                  handle_error(0x1fc017,
                               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                               ,0x1544,"first >= 0 && first <= len");
                }
                puVar31 = puVar22;
                if (puVar22 == (undefined1 *)0xffffffffffffffff) {
                  puVar31 = (undefined1 *)local_288.len;
                }
                if (puVar31 < pTVar28) {
                  if (((s_error_flags & 1) != 0) && (bVar18 = is_debugger_attached(), bVar18)) {
                    pcVar5 = (code *)swi(3);
                    sVar19 = (*pcVar5)();
                    return sVar19;
                  }
                  handle_error(0x1fc017,
                               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                               ,0x1546,"first <= last");
                }
                if (local_288.len < puVar31) {
                  if (((s_error_flags & 1) != 0) && (bVar18 = is_debugger_attached(), bVar18)) {
                    pcVar5 = (code *)swi(3);
                    sVar19 = (*pcVar5)();
                    return sVar19;
                  }
                  handle_error(0x1fc017,
                               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                               ,0x1547,"last >= 0 && last <= len");
                }
                basic_substring<const_char>::basic_substring
                          (&local_278,local_288.str + (long)pTVar28,(long)puVar31 - (long)pTVar28);
                uVar27 = local_1f8;
                lVar24 = CONCAT26(local_278.len._6_2_,
                                  CONCAT24(local_278.len._4_2_,
                                           CONCAT13(local_278.len._3_1_,
                                                    CONCAT21(local_278.len._1_2_,
                                                             (undefined1)local_278.len))));
                local_228 = puVar22;
                if ((lVar24 == 0) || (local_278.str == (char *)0x0)) {
                  if (((s_error_flags & 1) != 0) && (bVar18 = is_debugger_attached(), bVar18)) {
                    pcVar5 = (code *)swi(3);
                    sVar19 = (*pcVar5)();
                    return sVar19;
                  }
                  handle_error(0x1fc017,
                               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                               ,0x2cac,"!s.empty()");
                }
                bVar18 = lVar24 == 0;
                if (bVar18) {
                  cVar30 = '\0';
                }
                else {
                  lVar23 = 0;
                  cVar30 = '\0';
                  do {
                    cVar1 = local_278.str[lVar23];
                    bVar25 = cVar1 - 0x30;
                    if (9 < bVar25) {
                      if ((byte)(cVar1 + 0x9fU) < 6) {
                        bVar25 = cVar1 + 0xa9;
                      }
                      else {
                        if (5 < (byte)(cVar1 + 0xbfU)) break;
                        bVar25 = cVar1 - 0x37;
                      }
                    }
                    cVar30 = cVar30 * '\x10' + bVar25;
                    lVar23 = lVar23 + 1;
                    bVar18 = lVar24 == lVar23;
                  } while (!bVar18);
                }
                if ((!bVar18) || (cVar30 < '\0')) {
                  local_278.str = (char *)0x2064696c61766e69;
                  local_278.len._0_1_ = 0x55;
                  local_278.len._1_2_ = 0x4952;
                  local_278.len._3_1_ = 0x20;
                  local_278.len._4_2_ = 0x6863;
                  local_278.len._6_2_ = 0x7261;
                  uStack_268 = 0x61;
                  uStack_267 = 0x7463;
                  uStack_265 = 0x65;
                  uStack_264 = 0x72;
                  if (((s_error_flags & 1) != 0) && (bVar18 = is_debugger_attached(), bVar18)) {
                    pcVar5 = (code *)swi(3);
                    sVar19 = (*pcVar5)();
                    return sVar19;
                  }
                  local_170 = 0;
                  uStack_168 = 0x685a;
                  local_160 = 0;
                  pcStack_158 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                  ;
                  local_150 = 0x65;
                  LVar13.super_LineCol.col = 0;
                  LVar13.super_LineCol.offset = SUB168(ZEXT816(0x685a) << 0x40,0);
                  LVar13.super_LineCol.line = SUB168(ZEXT816(0x685a) << 0x40,8);
                  LVar13.name.str =
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                  ;
                  LVar13.name.len = 0x65;
                  (*(this->m_callbacks).m_error)
                            ((char *)&local_278,0x16,LVar13,(this->m_callbacks).m_user_data);
                }
                if (local_288.len < puVar20) {
                  if (((s_error_flags & 1) != 0) && (bVar18 = is_debugger_attached(), bVar18)) {
                    pcVar5 = (code *)swi(3);
                    sVar19 = (*pcVar5)();
                    return sVar19;
                  }
                  handle_error(0x1fc017,
                               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                               ,0x1544,"first >= 0 && first <= len");
                }
                if (puVar21 == (undefined1 *)0xffffffffffffffff) {
                  puVar21 = (undefined1 *)local_288.len;
                }
                if (puVar21 < puVar20) {
                  if (((s_error_flags & 1) != 0) && (bVar18 = is_debugger_attached(), bVar18)) {
                    pcVar5 = (code *)swi(3);
                    sVar19 = (*pcVar5)();
                    return sVar19;
                  }
                  handle_error(0x1fc017,
                               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                               ,0x1546,"first <= last");
                }
                if (local_288.len < puVar21) {
                  if (((s_error_flags & 1) != 0) && (bVar18 = is_debugger_attached(), bVar18)) {
                    pcVar5 = (code *)swi(3);
                    sVar19 = (*pcVar5)();
                    return sVar19;
                  }
                  handle_error(0x1fc017,
                               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                               ,0x1547,"last >= 0 && last <= len");
                }
                basic_substring<const_char>::basic_substring
                          (&local_278,puVar20 + (long)local_288.str,(long)puVar21 - (long)puVar20);
                lVar24 = local_218;
                pcVar2 = local_230;
                sVar4 = CONCAT26(local_278.len._6_2_,
                                 CONCAT24(local_278.len._4_2_,
                                          CONCAT13(local_278.len._3_1_,
                                                   CONCAT21(local_278.len._1_2_,
                                                            (undefined1)local_278.len))));
                memcpy(local_230 + local_218,local_278.str,sVar4);
                local_218 = lVar24 + sVar4 + 1;
                pcVar2[sVar4 + lVar24] = cVar30;
                puVar21 = (undefined1 *)
                          basic_substring<const_char>::first_of(&local_288,'%',(size_t)local_238);
                node_id = local_220;
                puVar20 = local_228;
              } while (puVar21 != (undefined1 *)0xffffffffffffffff);
              if (local_228 == (undefined1 *)0x0) {
                uStack_268 = 0x72;
                uStack_267 = 0x7665;
                uStack_265 = 0x20;
                uStack_264 = 0x203e;
                uStack_262 = 0x2930;
                uStack_260 = 0;
                local_278.str = (char *)0x6166206b63656863;
                local_278.len._0_1_ = 0x69;
                local_278.len._1_2_ = 0x656c;
                local_278.len._3_1_ = 100;
                local_278.len._4_2_ = 0x203a;
                local_278.len._6_2_ = 0x7028;
                if (((s_error_flags & 1) != 0) && (bVar18 = is_debugger_attached(), bVar18)) {
                  pcVar5 = (code *)swi(3);
                  sVar19 = (*pcVar5)();
                  return sVar19;
                }
                local_198 = 0;
                uStack_190 = 0x6861;
                local_188 = 0;
                pcStack_180 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_178 = 0x65;
                LVar14.super_LineCol.col = 0;
                LVar14.super_LineCol.offset = SUB168(ZEXT816(0x6861) << 0x40,0);
                LVar14.super_LineCol.line = SUB168(ZEXT816(0x6861) << 0x40,8);
                LVar14.name.str =
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                LVar14.name.len = 0x65;
                (*(this->m_callbacks).m_error)
                          ((char *)&local_278,0x19,LVar14,(this->m_callbacks).m_user_data);
              }
              if (local_288.len < local_228) {
                uStack_268 = 0x65;
                uStack_267 = 0x7473;
                uStack_265 = 0x2e;
                uStack_264 = 0x656c;
                uStack_262 = 0x206e;
                uStack_260 = 0x3e;
                uStack_25f = 0x203d;
                uStack_25d = 0x70;
                uStack_25c = 0x29766572;
                local_278.str = (char *)0x6166206b63656863;
                local_278.len._0_1_ = 0x69;
                local_278.len._1_2_ = 0x656c;
                local_278.len._3_1_ = 100;
                local_278.len._4_2_ = 0x203a;
                local_278.len._6_2_ = 0x7228;
                uStack_258 = 0;
                if (((s_error_flags & 1) != 0) && (bVar18 = is_debugger_attached(), bVar18)) {
                  pcVar5 = (code *)swi(3);
                  sVar19 = (*pcVar5)();
                  return sVar19;
                }
                local_1c0 = 0;
                uStack_1b8 = 0x6862;
                local_1b0 = 0;
                pcStack_1a8 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_1a0 = 0x65;
                LVar15.super_LineCol.col = 0;
                LVar15.super_LineCol.offset = SUB168(ZEXT816(0x6862) << 0x40,0);
                LVar15.super_LineCol.line = SUB168(ZEXT816(0x6862) << 0x40,8);
                LVar15.name.str =
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                LVar15.name.len = 0x65;
                (*(this->m_callbacks).m_error)
                          ((char *)&local_278,0x21,LVar15,(this->m_callbacks).m_user_data);
              }
              if (local_288.len < local_228) {
                if (((s_error_flags & 1) != 0) && (bVar18 = is_debugger_attached(), bVar18)) {
                  pcVar5 = (code *)swi(3);
                  sVar19 = (*pcVar5)();
                  return sVar19;
                }
                handle_error(0x1fc017,
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             ,0x1533,"first >= 0 && first <= len");
              }
              basic_substring<const_char>::basic_substring
                        (&local_278,local_288.str + (long)local_228,local_288.len - (long)local_228)
              ;
              lVar24 = local_218;
              pcVar2 = local_230;
              sVar4 = CONCAT26(local_278.len._6_2_,
                               CONCAT24(local_278.len._4_2_,
                                        CONCAT13(local_278.len._3_1_,
                                                 CONCAT21(local_278.len._1_2_,
                                                          (undefined1)local_278.len))));
              memcpy(local_230 + local_218,local_278.str,sVar4);
              pcVar2[sVar4 + lVar24] = '>';
              if ((undefined1 *)(sVar4 + lVar24 + 1) != local_240) {
                uStack_268 = 0x70;
                uStack_267 = 0x736f;
                uStack_265 = 0x20;
                uStack_264 = 0x3d3d;
                uStack_262 = 0x6c20;
                uStack_260 = 0x65;
                uStack_25f = 0x296e;
                uStack_25d = 0;
                local_278.str = (char *)0x6166206b63656863;
                local_278.len._0_1_ = 0x69;
                local_278.len._1_2_ = 0x656c;
                local_278.len._3_1_ = 100;
                local_278.len._4_2_ = 0x203a;
                local_278.len._6_2_ = 0x7728;
                if (((s_error_flags & 1) != 0) && (bVar18 = is_debugger_attached(), bVar18)) {
                  pcVar5 = (code *)swi(3);
                  sVar19 = (*pcVar5)();
                  return sVar19;
                }
                local_1e8 = 0;
                uStack_1e0 = 0x6865;
                local_1d8 = 0;
                pcStack_1d0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_1c8 = 0x65;
                LVar16.super_LineCol.col = 0;
                LVar16.super_LineCol.offset = SUB168(ZEXT816(0x6865) << 0x40,0);
                LVar16.super_LineCol.line = SUB168(ZEXT816(0x6865) << 0x40,8);
                LVar16.name.str =
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                LVar16.name.len = 0x65;
                (*(this->m_callbacks).m_error)
                          ((char *)&local_278,0x1c,LVar16,(this->m_callbacks).m_user_data);
              }
            }
          }
          bVar18 = true;
        }
      }
    }
    if (bVar18) {
      return (size_t)local_240;
    }
    bVar18 = lVar29 == 0;
    lVar29 = lVar29 + -1;
    if (bVar18) {
      return 0;
    }
  } while( true );
}

Assistant:

size_t Tree::resolve_tag(substr output, csubstr tag, size_t node_id) const
{
    // lookup from the end. We want to find the first directive that
    // matches the tag and has a target node id leq than the given
    // node_id.
    for(size_t i = RYML_MAX_TAG_DIRECTIVES-1; i != (size_t)-1; --i)
    {
        auto const& td = m_tag_directives[i];
        if(td.handle.empty())
            continue;
        if(tag.begins_with(td.handle) && td.next_node_id <= node_id)
        {
            _RYML_CB_ASSERT(m_callbacks, tag.len >= td.handle.len);
            csubstr rest = tag.sub(td.handle.len);
            size_t len = 1u + td.prefix.len + rest.len + 1u;
            size_t numpc = rest.count('%');
            if(numpc == 0)
            {
                if(len <= output.len)
                {
                    output.str[0] = '<';
                    memcpy(1u + output.str, td.prefix.str, td.prefix.len);
                    memcpy(1u + output.str + td.prefix.len, rest.str, rest.len);
                    output.str[1u + td.prefix.len + rest.len] = '>';
                }
            }
            else
            {
                // need to decode URI % sequences
                size_t pos = rest.find('%');
                _RYML_CB_ASSERT(m_callbacks, pos != npos);
                do {
                    size_t next = rest.first_not_of("0123456789abcdefABCDEF", pos+1);
                    if(next == npos)
                        next = rest.len;
                    _RYML_CB_CHECK(m_callbacks, pos+1 < next);
                    _RYML_CB_CHECK(m_callbacks, pos+1 + 2 <= next);
                    size_t delta = next - (pos+1);
                    len -= delta;
                    pos = rest.find('%', pos+1);
                } while(pos != npos);
                if(len <= output.len)
                {
                    size_t prev = 0, wpos = 0;
                    auto appendstr = [&](csubstr s) { memcpy(output.str + wpos, s.str, s.len); wpos += s.len; };
                    auto appendchar = [&](char c) { output.str[wpos++] = c; };
                    appendchar('<');
                    appendstr(td.prefix);
                    pos = rest.find('%');
                    _RYML_CB_ASSERT(m_callbacks, pos != npos);
                    do {
                        size_t next = rest.first_not_of("0123456789abcdefABCDEF", pos+1);
                        if(next == npos)
                            next = rest.len;
                        _RYML_CB_CHECK(m_callbacks, pos+1 < next);
                        _RYML_CB_CHECK(m_callbacks, pos+1 + 2 <= next);
                        uint8_t val;
                        if(C4_UNLIKELY(!read_hex(rest.range(pos+1, next), &val) || val > 127))
                            _RYML_CB_ERR(m_callbacks, "invalid URI character");
                        appendstr(rest.range(prev, pos));
                        appendchar((char)val);
                        prev = next;
                        pos = rest.find('%', pos+1);
                    } while(pos != npos);
                    _RYML_CB_ASSERT(m_callbacks, pos == npos);
                    _RYML_CB_ASSERT(m_callbacks, prev > 0);
                    _RYML_CB_ASSERT(m_callbacks, rest.len >= prev);
                    appendstr(rest.sub(prev));
                    appendchar('>');
                    _RYML_CB_ASSERT(m_callbacks, wpos == len);
                }
            }
            return len;
        }
    }
    return 0; // return 0 to signal that the tag is local and cannot be resolved
}